

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,NodeScalar *sc,NodeType flags,size_t ilevel)

{
  size_t *psVar1;
  csubstr *this_00;
  ulong uVar2;
  code *pcVar3;
  Location loc;
  Location loc_00;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  error_flags eVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  bool explicit_key;
  uint uVar12;
  basic_substring<const_char> bVar13;
  csubstr s;
  csubstr s_00;
  char msg [133];
  basic_substring<const_char> local_b8;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  
  if ((sc->tag).str != (char *)0x0 && (sc->tag).len != 0) {
    _write_tag(this,sc->tag);
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  uVar12 = (uint)flags.type;
  if ((flags.type & (VALANCH|KEYANCH)) == NOTYPE) {
    if ((flags.type & (VALREF|KEYREF)) != NOTYPE) {
      iVar8 = basic_substring<const_char>::compare(&sc->anchor,"<<",2);
      if (iVar8 != 0) {
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
      pcVar11 = (sc->anchor).str;
      sVar9 = (sc->anchor).len;
      if (pcVar11 == (char *)0x0 || sVar9 == 0) {
        return;
      }
      std::ostream::write((char *)(this->
                                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream,(long)pcVar11);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + sVar9;
      return;
    }
  }
  else {
    if ((flags.type & (VALREF|KEYREF)) != NOTYPE) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_b8.str = (char *)0x0;
      local_b8.len = 0x5a05;
      local_a8 = 0;
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98 = 0x65;
      loc.super_LineCol.col = 0;
      loc.super_LineCol.offset = SUB168(ZEXT816(0x5a05) << 0x40,0);
      loc.super_LineCol.line = SUB168(ZEXT816(0x5a05) << 0x40,8);
      loc.name.str = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc.name.len = 0x65;
      error("check failed: flags.is_ref() != flags.has_anchor()",0x32,loc);
    }
    if (((sc->anchor).len == 0) || ((sc->anchor).str == (char *)0x0)) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_b8.str = (char *)0x0;
      local_b8.len = 0x5a06;
      local_a8 = 0;
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98 = 0x65;
      loc_00.super_LineCol.col = 0;
      loc_00.super_LineCol.offset = SUB168(ZEXT816(0x5a06) << 0x40,0);
      loc_00.super_LineCol.line = SUB168(ZEXT816(0x5a06) << 0x40,8);
      loc_00.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_00.name.len = 0x65;
      error("check failed: ! sc.anchor.empty()",0x21,loc_00);
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
    pcVar11 = (sc->anchor).str;
    sVar9 = (sc->anchor).len;
    if (pcVar11 != (char *)0x0 && sVar9 != 0) {
      std::ostream::write((char *)(this->
                                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream,(long)pcVar11);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + sVar9;
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  if (((flags.type &
       (_WIP_VAL_PLAIN|_WIP_KEY_PLAIN|_WIP_VAL_DQUO|_WIP_KEY_DQUO|_WIP_VAL_SQUO|_WIP_KEY_SQUO|
        _WIP_VAL_FOLDED|_WIP_KEY_FOLDED|_WIP_VAL_LITERAL|_WIP_KEY_LITERAL)) != NOTYPE) &&
     (((flags.type & _WIP_KEY_STYLE) == NOTYPE) != ((flags.type & _WIP_VAL_STYLE) != NOTYPE))) {
    memcpy(&local_b8,
           "check failed: (((flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE)) == 0) || (((flags&_WIP_KEY_STYLE) == 0) != ((flags&_WIP_VAL_STYLE) == 0)))"
           ,0x85);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5a14) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x5a14) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_tree->m_callbacks).m_error)
              ((char *)&local_b8,0x85,LVar4,(this->m_tree->m_callbacks).m_user_data);
  }
  if ((flags.type & (_WIP_VAL_LITERAL|_WIP_KEY_LITERAL)) == NOTYPE) {
    if ((flags.type & (_WIP_VAL_FOLDED|_WIP_KEY_FOLDED)) != NOTYPE) {
      _write_scalar_folded(this,sc->scalar,ilevel,SUB41((uVar12 & 2) >> 1,0));
      return;
    }
    if ((flags.type & (_WIP_VAL_SQUO|_WIP_KEY_SQUO)) != NOTYPE) {
      _write_scalar_squo(this,sc->scalar,ilevel);
      return;
    }
    if ((flags.type & (_WIP_VAL_DQUO|_WIP_KEY_DQUO)) != NOTYPE) {
      _write_scalar_dquo(this,sc->scalar,ilevel);
      return;
    }
    if ((flags.type & (_WIP_VAL_PLAIN|_WIP_KEY_PLAIN)) != NOTYPE) {
      _write_scalar_plain(this,sc->scalar,ilevel);
      return;
    }
    if ((flags.type &
        (_WIP_VAL_PLAIN|_WIP_KEY_PLAIN|_WIP_VAL_DQUO|_WIP_KEY_DQUO|_WIP_VAL_SQUO|_WIP_KEY_SQUO|
         _WIP_VAL_FOLDED|_WIP_KEY_FOLDED|_WIP_VAL_LITERAL|_WIP_KEY_LITERAL)) != NOTYPE) {
      local_b8.str = (char *)0x6c706d6920746f6e;
      local_b8.len._0_1_ = 'e';
      local_b8.len._1_1_ = 'm';
      local_b8.len._2_1_ = 'e';
      local_b8.len._3_1_ = 'n';
      local_b8.len._4_1_ = 't';
      local_b8.len._5_1_ = 'e';
      local_b8.len._6_1_ = 'd';
      local_b8.len._7_1_ = '\0';
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x5a47) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x5a47) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_tree->m_callbacks).m_error)
                ((char *)&local_b8,0x10,LVar5,(this->m_tree->m_callbacks).m_user_data);
      return;
    }
    this_00 = &sc->scalar;
    bVar6 = false;
    sVar9 = basic_substring<const_char>::first_not_of(this_00,'\n',0);
    if (sVar9 != 0xffffffffffffffff) {
      uVar2 = (sc->scalar).len;
      if (uVar2 < sVar9) {
        eVar7 = get_error_flags();
        if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        handle_error(0x2467aa,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring(&local_b8,this_00->str + sVar9,uVar2 - sVar9);
      if (local_b8.len == 0) {
        bVar6 = false;
      }
      else {
        bVar6 = *local_b8.str == '\t' || *local_b8.str == ' ';
      }
    }
    pcVar11 = (sc->scalar).str;
    sVar10 = (sc->scalar).len;
    if (((pcVar11 != (char *)0x0 && sVar10 != 0) && sVar9 == 0xffffffffffffffff) || (bVar6 == false)
       ) {
      if ((pcVar11 == (char *)0x0 || sVar10 == 0) || sVar9 != 0xffffffffffffffff) goto LAB_001e0818;
    }
    else {
      bVar13 = basic_substring<const_char>::trim(this_00,' ');
      if (bVar13.str == (char *)0x0 || bVar13.len == 0) {
        pcVar11 = (sc->scalar).str;
        sVar10 = (sc->scalar).len;
LAB_001e0818:
        if (sVar10 != 0) {
          sVar9 = 0;
          do {
            if (pcVar11[sVar9] == '\n') goto LAB_001e07f5;
            sVar9 = sVar9 + 1;
          } while (sVar10 != sVar9);
        }
        s_00.len = sVar10;
        s_00.str = pcVar11;
        _write_scalar(this,s_00,(~uVar12 & 0x1001) == 0 || (~uVar12 & 0x2002) == 0);
        return;
      }
      pcVar11 = (sc->scalar).str;
      sVar10 = (sc->scalar).len;
    }
LAB_001e07f5:
    explicit_key = SUB41((uVar12 & 2) >> 1,0);
  }
  else {
    pcVar11 = (sc->scalar).str;
    sVar10 = (sc->scalar).len;
    explicit_key = SUB41((uVar12 & 2) >> 1,0);
    bVar6 = false;
  }
  s.len = sVar10;
  s.str = pcVar11;
  _write_scalar_literal(this,s,ilevel,explicit_key,bVar6);
  return;
}

Assistant:

void Emitter<Writer>::_write(NodeScalar const& C4_RESTRICT sc, NodeType flags, size_t ilevel)
{
    if( ! sc.tag.empty())
    {
        _write_tag(sc.tag);
        this->Writer::_do_write(' ');
    }
    if(flags.has_anchor())
    {
        RYML_ASSERT(flags.is_ref() != flags.has_anchor());
        RYML_ASSERT( ! sc.anchor.empty());
        this->Writer::_do_write('&');
        this->Writer::_do_write(sc.anchor);
        this->Writer::_do_write(' ');
    }
    else if(flags.is_ref())
    {
        if(sc.anchor != "<<")
            this->Writer::_do_write('*');
        this->Writer::_do_write(sc.anchor);
        return;
    }

    // ensure the style flags only have one of KEY or VAL
    _RYML_CB_ASSERT(m_tree->callbacks(), ((flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE)) == 0) || (((flags&_WIP_KEY_STYLE) == 0) != ((flags&_WIP_VAL_STYLE) == 0)));

    auto style_marks = flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE);
    if(style_marks & (_WIP_KEY_LITERAL|_WIP_VAL_LITERAL))
    {
        _write_scalar_literal(sc.scalar, ilevel, flags.has_key());
    }
    else if(style_marks & (_WIP_KEY_FOLDED|_WIP_VAL_FOLDED))
    {
        _write_scalar_folded(sc.scalar, ilevel, flags.has_key());
    }
    else if(style_marks & (_WIP_KEY_SQUO|_WIP_VAL_SQUO))
    {
        _write_scalar_squo(sc.scalar, ilevel);
    }
    else if(style_marks & (_WIP_KEY_DQUO|_WIP_VAL_DQUO))
    {
        _write_scalar_dquo(sc.scalar, ilevel);
    }
    else if(style_marks & (_WIP_KEY_PLAIN|_WIP_VAL_PLAIN))
    {
        _write_scalar_plain(sc.scalar, ilevel);
    }
    else if(!style_marks)
    {
        size_t first_non_nl = sc.scalar.first_not_of('\n');
        bool all_newlines = first_non_nl == npos;
        bool has_leading_ws = (!all_newlines) && sc.scalar.sub(first_non_nl).begins_with_any(" \t");
        bool do_literal = ((!sc.scalar.empty() && all_newlines) || (has_leading_ws && !sc.scalar.trim(' ').empty()));
        if(do_literal)
        {
            _write_scalar_literal(sc.scalar, ilevel, flags.has_key(), /*explicit_indentation*/has_leading_ws);
        }
        else
        {
            for(size_t i = 0; i < sc.scalar.len; ++i)
            {
                if(sc.scalar.str[i] == '\n')
                {
                    _write_scalar_literal(sc.scalar, ilevel, flags.has_key(), /*explicit_indentation*/has_leading_ws);
                    goto wrote_special;
                }
                // todo: check for escaped characters requiring double quotes
            }
            _write_scalar(sc.scalar, flags.is_quoted());
        wrote_special:
            ;
        }
    }
    else
    {
        _RYML_CB_ERR(m_tree->callbacks(), "not implemented");
    }
}